

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void arm_cpu_update_vfiq_arm(ARMCPU *cpu)

{
  bool bVar1;
  
  bVar1 = true;
  if (((cpu->env).cp15.hcr_el2 & 0x40) == 0) {
    bVar1 = (bool)((*(byte *)((long)&(cpu->env).irq_line_state + 1) & 2) >> 1);
  }
  if ((((cpu->parent_obj).interrupt_request & 0x200) == 0) != bVar1) {
    return;
  }
  if (bVar1 != false) {
    (*cpu_interrupt_handler)(&cpu->parent_obj,0x200);
    return;
  }
  cpu_reset_interrupt(&cpu->parent_obj,0x200);
  return;
}

Assistant:

void arm_cpu_update_vfiq(ARMCPU *cpu)
{
    /*
     * Update the interrupt level for VFIQ, which is the logical OR of
     * the HCR_EL2.VF bit and the input line level from the GIC.
     */
    CPUARMState *env = &cpu->env;
    CPUState *cs = CPU(cpu);

    bool new_state = (env->cp15.hcr_el2 & HCR_VF) ||
        (env->irq_line_state & CPU_INTERRUPT_VFIQ);

    if (new_state != ((cs->interrupt_request & CPU_INTERRUPT_VFIQ) != 0)) {
        if (new_state) {
            cpu_interrupt(cs, CPU_INTERRUPT_VFIQ);
        } else {
            cpu_reset_interrupt(cs, CPU_INTERRUPT_VFIQ);
        }
    }
}